

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,FileOptions *from)

{
  uint uVar1;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  long in_RSI;
  FileOptions *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_fffffffffffffef8;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff18;
  ExtensionSet *in_stack_ffffffffffffff48;
  ExtensionSet *in_stack_ffffffffffffff50;
  
  internal::ExtensionSet::MergeFrom(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 0x20);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                (this_00);
      in_stack_ffffffffffffff00 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff00 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)in_stack_ffffffffffffff00,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)in_stack_fffffffffffffef8);
  uVar1 = *(uint *)(in_RSI + 0x28);
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_java_package_abi_cxx11_((FileOptions *)0x4f0655);
      _internal_set_java_package(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 2) != 0) {
      _internal_java_outer_classname_abi_cxx11_((FileOptions *)0x4f067b);
      _internal_set_java_outer_classname(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 4) != 0) {
      _internal_go_package_abi_cxx11_((FileOptions *)0x4f06a1);
      _internal_set_go_package(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 8) != 0) {
      _internal_objc_class_prefix_abi_cxx11_((FileOptions *)0x4f06c7);
      _internal_set_objc_class_prefix(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 0x10) != 0) {
      _internal_csharp_namespace_abi_cxx11_((FileOptions *)0x4f06ed);
      _internal_set_csharp_namespace(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 0x20) != 0) {
      _internal_swift_prefix_abi_cxx11_((FileOptions *)0x4f0713);
      _internal_set_swift_prefix(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 0x40) != 0) {
      _internal_php_class_prefix_abi_cxx11_((FileOptions *)0x4f0739);
      _internal_set_php_class_prefix(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 0x80) != 0) {
      _internal_php_namespace_abi_cxx11_((FileOptions *)0x4f0761);
      _internal_set_php_namespace(in_RDI,in_stack_ffffffffffffff18);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      _internal_php_metadata_namespace_abi_cxx11_((FileOptions *)0x4f079d);
      _internal_set_php_metadata_namespace(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 0x200) != 0) {
      _internal_ruby_package_abi_cxx11_((FileOptions *)0x4f07c5);
      _internal_set_ruby_package(in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 0x400) != 0) {
      in_RDI->java_multiple_files_ = (bool)(*(byte *)(in_RSI + 0x98) & 1);
    }
    if ((uVar1 & 0x800) != 0) {
      in_RDI->java_generate_equals_and_hash_ = (bool)(*(byte *)(in_RSI + 0x99) & 1);
    }
    if ((uVar1 & 0x1000) != 0) {
      in_RDI->java_string_check_utf8_ = (bool)(*(byte *)(in_RSI + 0x9a) & 1);
    }
    if ((uVar1 & 0x2000) != 0) {
      in_RDI->cc_generic_services_ = (bool)(*(byte *)(in_RSI + 0x9b) & 1);
    }
    if ((uVar1 & 0x4000) != 0) {
      in_RDI->java_generic_services_ = (bool)(*(byte *)(in_RSI + 0x9c) & 1);
    }
    if ((uVar1 & 0x8000) != 0) {
      in_RDI->py_generic_services_ = (bool)(*(byte *)(in_RSI + 0x9d) & 1);
    }
    (in_RDI->_has_bits_).has_bits_[0] = uVar1 | (in_RDI->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0xf0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      in_RDI->php_generic_services_ = (bool)(*(byte *)(in_RSI + 0x9e) & 1);
    }
    if ((uVar1 & 0x20000) != 0) {
      in_RDI->deprecated_ = (bool)(*(byte *)(in_RSI + 0x9f) & 1);
    }
    if ((uVar1 & 0x40000) != 0) {
      in_RDI->cc_enable_arenas_ = (bool)(*(byte *)(in_RSI + 0xa0) & 1);
    }
    if ((uVar1 & 0x80000) != 0) {
      in_RDI->optimize_for_ = *(int *)(in_RSI + 0xa4);
    }
    (in_RDI->_has_bits_).has_bits_[0] = uVar1 | (in_RDI->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void FileOptions::MergeFrom(const FileOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_java_package(from._internal_java_package());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_java_outer_classname(from._internal_java_outer_classname());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_go_package(from._internal_go_package());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_set_objc_class_prefix(from._internal_objc_class_prefix());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_set_csharp_namespace(from._internal_csharp_namespace());
    }
    if (cached_has_bits & 0x00000020u) {
      _internal_set_swift_prefix(from._internal_swift_prefix());
    }
    if (cached_has_bits & 0x00000040u) {
      _internal_set_php_class_prefix(from._internal_php_class_prefix());
    }
    if (cached_has_bits & 0x00000080u) {
      _internal_set_php_namespace(from._internal_php_namespace());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _internal_set_php_metadata_namespace(from._internal_php_metadata_namespace());
    }
    if (cached_has_bits & 0x00000200u) {
      _internal_set_ruby_package(from._internal_ruby_package());
    }
    if (cached_has_bits & 0x00000400u) {
      java_multiple_files_ = from.java_multiple_files_;
    }
    if (cached_has_bits & 0x00000800u) {
      java_generate_equals_and_hash_ = from.java_generate_equals_and_hash_;
    }
    if (cached_has_bits & 0x00001000u) {
      java_string_check_utf8_ = from.java_string_check_utf8_;
    }
    if (cached_has_bits & 0x00002000u) {
      cc_generic_services_ = from.cc_generic_services_;
    }
    if (cached_has_bits & 0x00004000u) {
      java_generic_services_ = from.java_generic_services_;
    }
    if (cached_has_bits & 0x00008000u) {
      py_generic_services_ = from.py_generic_services_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x000f0000u) {
    if (cached_has_bits & 0x00010000u) {
      php_generic_services_ = from.php_generic_services_;
    }
    if (cached_has_bits & 0x00020000u) {
      deprecated_ = from.deprecated_;
    }
    if (cached_has_bits & 0x00040000u) {
      cc_enable_arenas_ = from.cc_enable_arenas_;
    }
    if (cached_has_bits & 0x00080000u) {
      optimize_for_ = from.optimize_for_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}